

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# svglayoutstate.cpp
# Opt level: O0

float __thiscall
lunasvg::parseNumberOrPercentage
          (lunasvg *this,string_view input,bool allowPercentage,float defaultValue)

{
  bool bVar1;
  float *pfVar2;
  float local_34;
  float local_30;
  float local_2c;
  float local_28;
  float value;
  float defaultValue_local;
  bool allowPercentage_local;
  string_view input_local;
  
  input_local._M_len = input._M_len;
  value._3_1_ = (byte)input._M_str & 1;
  local_28 = defaultValue;
  _defaultValue_local = this;
  bVar1 = parseNumber<float>((string_view *)&defaultValue_local,&local_2c);
  if (bVar1) {
    if ((value._3_1_ & 1) != 0) {
      bVar1 = skipDelimiter((string_view *)&defaultValue_local,'%');
      if (bVar1) {
        local_2c = local_2c / 100.0;
      }
      local_30 = 0.0;
      local_34 = 1.0;
      pfVar2 = std::clamp<float>(&local_2c,&local_30,&local_34);
      local_2c = *pfVar2;
    }
    bVar1 = std::basic_string_view<char,_std::char_traits<char>_>::empty
                      ((basic_string_view<char,_std::char_traits<char>_> *)&defaultValue_local);
    if (bVar1) {
      input_local._M_str._4_4_ = local_2c;
    }
    else {
      input_local._M_str._4_4_ = local_28;
    }
  }
  else {
    input_local._M_str._4_4_ = local_28;
  }
  return input_local._M_str._4_4_;
}

Assistant:

static float parseNumberOrPercentage(std::string_view input, bool allowPercentage, float defaultValue)
{
    float value;
    if(!parseNumber(input, value))
        return defaultValue;
    if(allowPercentage) {
        if(skipDelimiter(input, '%'))
            value /= 100.f;
        value = std::clamp(value, 0.f, 1.f);
    }

    if(!input.empty())
        return defaultValue;
    return value;
}